

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5.cc
# Opt level: O3

string * __thiscall
MD5::getDataChecksum_abi_cxx11_(string *__return_storage_ptr__,MD5 *this,char *buf,size_t len)

{
  uchar *puVar1;
  MD5 m;
  MD5 local_30;
  
  MD5(&local_30,(uchar *)this,(size_t)buf,(uchar *)len);
  puVar1 = QUtil::unsigned_char_pointer((char *)this);
  (*(local_30.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_QPDFCryptoImpl[4])
            (local_30.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             puVar1,buf);
  unparse_abi_cxx11_(__return_storage_ptr__,&local_30);
  if (local_30.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
MD5::getDataChecksum(char const* buf, size_t len)
{
    MD5 m;
    m.encodeDataIncrementally(buf, len);
    return m.unparse();
}